

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticSeverity.cpp
# Opt level: O0

ostream * psy::operator<<(ostream *os,DiagnosticSeverity severity)

{
  ostream *poVar1;
  void *this;
  DiagnosticSeverity severity_local;
  ostream *os_local;
  
  if (severity == Warning) {
    std::operator<<(os,"warning");
  }
  else if (severity == Error) {
    std::operator<<(os,"error");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/common/diagnostics/DiagnosticSeverity.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    this = (void *)std::ostream::operator<<(poVar1,0x26);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, DiagnosticSeverity severity)
{
    switch (severity)
    {
        case DiagnosticSeverity::Warning:
            os << "warning";
            break;
        case DiagnosticSeverity::Error:
            os << "error";
            break;
        default:
            PSY_ASSERT_FAIL_1(return os);
    }
    return os;
}